

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall libcellml::Model::hasUnlinkedUnits(Model *this)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ComponentPtr c;
  ComponentEntity CStack_38;
  
  uVar3 = 0;
  bVar1 = false;
  while( true ) {
    sVar2 = ComponentEntity::componentCount(&this->super_ComponentEntity);
    if ((bVar1 != false) || (sVar2 <= uVar3)) break;
    ComponentEntity::component(&CStack_38,(size_t)this);
    bVar1 = traverseComponentTreeForUnlinkedUnits((ComponentPtr *)&CStack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &CStack_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar3 = uVar3 + 1;
  }
  return bVar1;
}

Assistant:

bool Model::hasUnlinkedUnits()
{
    bool unlinkedUnits = false;
    for (size_t index = 0; index < componentCount() && !unlinkedUnits; ++index) {
        auto c = component(index);
        unlinkedUnits = traverseComponentTreeForUnlinkedUnits(c);
    }
    return unlinkedUnits;
}